

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)19>
                 (CurrentNodes<(TasGrid::TypeOneDRule)19> *current,double x)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *this;
  double extraout_XMM0_Qa;
  OptimizerResult OVar3;
  undefined1 local_a0 [8];
  CurrentNodes<(TasGrid::TypeOneDRule)20> companion;
  double n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  double x_local;
  CurrentNodes<(TasGrid::TypeOneDRule)19> *current_local;
  
  __end2 = ::std::vector<double,_std::allocator<double>_>::begin(&current->nodes);
  n = (double)::std::vector<double,_std::allocator<double>_>::end(&current->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&n);
    if (!bVar1) {
      CurrentNodes<(TasGrid::TypeOneDRule)20>::CurrentNodes
                ((CurrentNodes<(TasGrid::TypeOneDRule)20> *)local_a0,&current->nodes,x);
      OVar3 = computeMaximum<(TasGrid::TypeOneDRule)20>
                        ((CurrentNodes<(TasGrid::TypeOneDRule)20> *)local_a0);
      CurrentNodes<(TasGrid::TypeOneDRule)20>::~CurrentNodes
                ((CurrentNodes<(TasGrid::TypeOneDRule)20> *)local_a0);
      return -OVar3.value;
    }
    this = &__end2;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(this);
    companion.coeff_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar2;
    ::std::abs((int)this);
    if (extraout_XMM0_Qa < 1e-11) break;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end2);
  }
  return -1e+100;
}

Assistant:

double getValue<rule_mindelta>(CurrentNodes<rule_mindelta> const& current, double x){
    for(auto n : current.nodes) if (std::abs(x - n) < 10 * Maths::num_tol) return -1.E+100;

    CurrentNodes<rule_mindeltaodd> companion(current.nodes, x);
    return - computeMaximum(companion).value;
}